

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O3

void XUtf8DrawRtlString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                       char *string,int num_bytes)

{
  uint uVar1;
  XFontStruct **ppXVar2;
  uint ucs_00;
  Display *pDVar3;
  GC p_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined2 *puVar10;
  long lVar11;
  ulong uVar12;
  uint ucs;
  XChar2b buf [128];
  undefined2 local_19a;
  int local_198;
  unsigned_short local_192;
  int local_190;
  int local_18c;
  int local_188;
  uint local_184;
  Display *local_180;
  GC local_178;
  uchar *local_170;
  undefined2 *local_168;
  Drawable local_160;
  int local_158;
  uint local_154;
  int *local_150;
  int *local_148;
  long local_140;
  undefined2 local_3a;
  undefined2 local_38 [4];
  
  uVar1 = font_set->nb_font;
  if ((int)uVar1 < 1) {
    return;
  }
  local_150 = font_set->ranges;
  local_148 = font_set->encodings;
  ppXVar2 = font_set->fonts;
  uVar9 = 0;
  while (ppXVar2[uVar9] == (XFontStruct *)0x0) {
    uVar9 = uVar9 + 1;
    if (uVar1 == uVar9) {
      return;
    }
  }
  if (num_bytes < 1) {
    return;
  }
  iVar8 = 0;
  uVar12 = uVar9 & 0xffffffff;
  puVar10 = local_38;
  local_198 = x;
  local_190 = y;
  local_180 = display;
  local_178 = gc;
  local_160 = d;
  do {
    local_158 = (int)uVar12;
    lVar11 = (long)local_158;
    local_170 = (uchar *)string;
    local_168 = puVar10;
    local_140 = lVar11;
    if (0x78 < iVar8) {
      XSetFont(local_180,local_178,ppXVar2[lVar11]->fid);
      puVar10 = local_168;
      iVar5 = XTextWidth16(ppXVar2[lVar11],local_168,iVar8);
      string = (char *)local_170;
      local_198 = local_198 - iVar5;
      XDrawString16(local_180,local_160,local_178,local_198,local_190,puVar10,iVar8);
      local_18c = 0;
      iVar8 = local_18c;
      local_168 = local_38;
    }
    local_18c = iVar8;
    local_154 = XFastConvertUtf8ToUcs((uchar *)string,num_bytes,&local_184);
    if ((int)local_154 < 2) {
      local_154 = 1;
    }
    local_192 = XUtf8IsNonSpacing(local_184);
    if (local_192 != 0) {
      local_184 = (uint)local_192;
    }
    ucs_00 = local_184;
    uVar12 = uVar9;
    local_188 = num_bytes;
    if ((int)uVar9 < (int)uVar1) {
      do {
        if (ppXVar2[uVar12] != (XFontStruct *)0x0) {
          iVar8 = local_148[uVar12];
          iVar5 = ucs2fontmap((char *)&local_19a,ucs_00,iVar8);
          if ((-1 < iVar5) &&
             ((iVar8 != 0 ||
              ((local_150[uVar12 * 2] <= (int)ucs_00 && ((int)ucs_00 <= local_150[uVar12 * 2 + 1])))
              ))) goto LAB_001fb566;
        }
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
LAB_001fb56b:
      ucs2fontmap((char *)&local_19a,0x3f,local_148[uVar9]);
      uVar12 = uVar9 & 0xffffffff;
    }
    else {
      uVar12 = uVar9 & 0xffffffff;
LAB_001fb566:
      if ((uint)uVar12 == uVar1) goto LAB_001fb56b;
    }
    lVar11 = local_140;
    iVar5 = (int)uVar12;
    if ((local_192 == 0) && (local_158 == iVar5)) {
      *(char *)(local_168 + -1) = (char)local_19a;
      *(undefined1 *)((long)local_168 + -1) = local_19a._1_1_;
      puVar10 = local_168 + -1;
      iVar8 = local_18c + 1;
    }
    else {
      XSetFont(local_180,local_178,ppXVar2[local_140]->fid);
      puVar10 = local_168;
      iVar8 = local_18c;
      iVar6 = XTextWidth16(ppXVar2[lVar11],local_168,local_18c);
      iVar6 = local_198 - iVar6;
      XDrawString16(local_180,local_160,local_178,iVar6,local_190,puVar10,iVar8);
      local_3a = local_19a;
      if (local_192 == 0) {
        iVar8 = 1;
        puVar10 = &local_3a;
        local_198 = iVar6;
      }
      else {
        puVar10 = &local_3a;
        iVar7 = XTextWidth16(ppXVar2[iVar5],puVar10,1);
        iVar8 = 1;
        local_198 = iVar6 + iVar7;
      }
    }
    p_Var4 = local_178;
    pDVar3 = local_180;
    string = (char *)(local_170 + local_154);
    num_bytes = local_188 - local_154;
    if (num_bytes == 0 || local_188 < (int)local_154) {
      if (0 < iVar8) {
        XSetFont(local_180,local_178,ppXVar2[iVar5]->fid);
        iVar5 = XTextWidth16(ppXVar2[iVar5],puVar10,iVar8);
        XDrawString16(pDVar3,local_160,p_Var4,local_198 - iVar5,local_190,puVar10,iVar8);
      }
      return;
    }
  } while( true );
}

Assistant:

void
XUtf8DrawRtlString(Display 		*display,
		   Drawable 		d,
		   XUtf8FontStruct 	*font_set,
		   GC 			gc,
		   int 			x,
		   int 			y,
		   const char		*string,
		   int 			num_bytes) {

  int 		*encodings;	/* encodings array */
  XFontStruct 	**fonts;	/* fonts array */
  Fl_XChar2b 	buf[128];	/* drawing buffer */
  Fl_XChar2b	*ptr;		/* pointer to the drawing buffer */
  int 		fnum;		/* index of the current font in the fonts array*/
  int 		i;		/* current byte in the XChar2b buffer */
  int 		first;		/* first valid font index */
  int 		last_fnum;	/* font index of the previous char */
  int 		nb_font;	/* quantity of fonts in the font array */
  char 		glyph[2];	/* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;	/* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;
  ptr = buf + 128;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      x -= XTextWidth16(fonts[fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 128;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] && (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      x -= XTextWidth16(fonts[last_fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 127;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
      if (no_spc) {
	x += XTextWidth16(fonts[fnum], ptr, 1);
      }
    } else {
      ptr--;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  if (i < 1) return;

  XSetFont(display, gc, fonts[fnum]->fid);
  x -= XTextWidth16(fonts[last_fnum], ptr, i);
  XDrawString16(display, d, gc, x, y, ptr, i);
}